

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  int *in_RSI;
  undefined8 *in_RDI;
  int err;
  uv_cpu_info_t *ci;
  uint numcpus;
  uv_cpu_info_t *in_stack_000003f8;
  uint in_stack_00000400;
  uv_cpu_info_t *in_stack_00000448;
  uint in_stack_00000450;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  *in_RDI = 0;
  *in_RSI = 0;
  uVar2 = sysconf(0x54);
  iVar1 = (int)uVar2;
  if (iVar1 == -1) {
    __assert_fail("numcpus != (unsigned int) -1","src/unix/linux-core.c",0x1d3,
                  "int uv_cpu_info(uv_cpu_info_t **, int *)");
  }
  if (iVar1 != 0) {
    pvVar3 = calloc(uVar2 & 0xffffffff,0x38);
    if (pvVar3 == (void *)0x0) {
      local_4 = -0xc;
    }
    else {
      local_4 = read_models(in_stack_00000400,in_stack_000003f8);
      if (local_4 == 0) {
        local_4 = read_times(in_stack_00000450,in_stack_00000448);
      }
      if (local_4 == 0) {
        if (*(int *)((long)pvVar3 + 8) == 0) {
          read_speeds(0,(uv_cpu_info_t *)
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        }
        *in_RDI = pvVar3;
        *in_RSI = iVar1;
        local_4 = 0;
      }
      else {
        uv_free_cpu_info((uv_cpu_info_t *)CONCAT44(local_4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
      }
    }
    return local_4;
  }
  __assert_fail("numcpus != 0","src/unix/linux-core.c",0x1d4,
                "int uv_cpu_info(uv_cpu_info_t **, int *)");
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;

  *cpu_infos = NULL;
  *count = 0;

  numcpus = sysconf(_SC_NPROCESSORS_ONLN);
  assert(numcpus != (unsigned int) -1);
  assert(numcpus != 0);

  ci = calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    return -ENOMEM;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    return err;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;

  return 0;
}